

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

void mpi_sub_hlp(size_t n,mbedtls_mpi_uint *s,mbedtls_mpi_uint *d)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  for (sVar2 = 0; n != sVar2; sVar2 = sVar2 + 1) {
    uVar1 = *d;
    uVar3 = uVar1 - uVar4;
    *d = uVar3;
    uVar4 = (ulong)(uVar3 < s[sVar2]) + (ulong)(uVar1 < uVar4);
    *d = uVar3 - s[sVar2];
    d = d + 1;
  }
  for (; uVar4 != 0; uVar4 = (ulong)(uVar1 < uVar4)) {
    uVar1 = *d;
    *d = *d - uVar4;
    d = d + 1;
  }
  return;
}

Assistant:

static void mpi_sub_hlp( size_t n, mbedtls_mpi_uint *s, mbedtls_mpi_uint *d )
{
    size_t i;
    mbedtls_mpi_uint c, z;

    for( i = c = 0; i < n; i++, s++, d++ )
    {
        z = ( *d <  c );     *d -=  c;
        c = ( *d < *s ) + z; *d -= *s;
    }

    while( c != 0 )
    {
        z = ( *d < c ); *d -= c;
        c = z; i++; d++;
    }
}